

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_morph.cpp
# Opt level: O3

bool __thiscall
ON_Localizer::CreatePlaneLocalizer
          (ON_Localizer *this,ON_3dPoint P,ON_3dVector N,double h0,double h1)

{
  double dVar1;
  bool bVar2;
  
  Destroy(this);
  bVar2 = ON_3dPoint::IsValid(&P);
  if (bVar2) {
    bVar2 = ON_3dVector::IsValid(&N);
    if (bVar2) {
      dVar1 = ON_3dVector::Length(&N);
      if (0.0 < dVar1) {
        bVar2 = ON_IsValid(h0);
        if (bVar2) {
          bVar2 = ON_IsValid(h1);
          if (h0 != h1 && bVar2) {
            (this->m_V).z = N.z;
            (this->m_V).x = N.x;
            (this->m_V).y = N.y;
            ON_3dVector::Unitize(&this->m_V);
            ON_3dPoint::Set(&this->m_P,
                            -((this->m_V).z * P.z + (this->m_V).x * P.x + (this->m_V).y * P.y),0.0,
                            0.0);
            ON_Interval::Set(&this->m_d,h0,h1);
            this->m_type = plane_type;
          }
        }
      }
    }
  }
  return this->m_type == plane_type;
}

Assistant:

bool ON_Localizer::CreatePlaneLocalizer( ON_3dPoint P, ON_3dVector N, double h0, double h1 )
{
  Destroy();
  if ( P.IsValid()
       && N.IsValid()
       && N.Length() > 0.0
       && ON_IsValid(h0)
       && ON_IsValid(h1)
       && h0 != h1 )
  {
    m_V = N;
    m_V.Unitize();
    m_P.Set( -(m_V.x*P.x + m_V.y*P.y + m_V.z*P.z), 0.0, 0.0 );
    m_d.Set(h0,h1);
    m_type = plane_type;
  }
  return (plane_type == m_type);
}